

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O2

void __thiscall
Scene<char>::add<SimpleMesh<SimpleVertex>,SimpleVertex,CharShader,myTexture>
          (Scene<char> *this,
          Object<SimpleMesh<SimpleVertex>,_SimpleVertex,_CharShader,_myTexture> *o)

{
  undefined1 local_59;
  undefined1 local_58 [40];
  vector<SimpleMesh<SimpleVertex>,_std::allocator<SimpleMesh<SimpleVertex>_>_> local_30;
  ObjectInfo *local_18;
  
  std::vector<SimpleMesh<SimpleVertex>,_std::allocator<SimpleMesh<SimpleVertex>_>_>::vector
            (&local_30,&o->mesh);
  std::vector<bounding_sphere,_std::allocator<bounding_sphere>_>::vector
            ((vector<bounding_sphere,_std::allocator<bounding_sphere>_> *)(local_58 + 0x10),
             &o->boundingSpheres);
  local_18 = o->info;
  std::
  make_unique<DedicatedPipelineImpl<char,SimpleMesh<SimpleVertex>,SimpleVertex,CharShader,myTexture>,std::vector<SimpleMesh<SimpleVertex>,std::allocator<SimpleMesh<SimpleVertex>>>,CharShader,std::tuple<myTexture>const&,std::vector<bounding_sphere,std::allocator<bounding_sphere>>,ObjectInfo*>
            ((vector<SimpleMesh<SimpleVertex>,_std::allocator<SimpleMesh<SimpleVertex>_>_> *)
             local_58,(CharShader *)&local_30,(tuple<myTexture> *)&local_59,
             (vector<bounding_sphere,_std::allocator<bounding_sphere>_> *)&o->textures,
             (ObjectInfo **)(local_58 + 0x10));
  local_58._8_8_ = local_58._0_8_;
  local_58._0_8_ =
       (__uniq_ptr_impl<DedicatedPipelineImpl<char,_SimpleMesh<SimpleVertex>,_SimpleVertex,_CharShader,_myTexture>,_std::default_delete<DedicatedPipelineImpl<char,_SimpleMesh<SimpleVertex>,_SimpleVertex,_CharShader,_myTexture>_>_>
        )0x0;
  std::
  vector<std::unique_ptr<DedicatedPipeline<char>,std::default_delete<DedicatedPipeline<char>>>,std::allocator<std::unique_ptr<DedicatedPipeline<char>,std::default_delete<DedicatedPipeline<char>>>>>
  ::
  emplace_back<std::unique_ptr<DedicatedPipeline<char>,std::default_delete<DedicatedPipeline<char>>>>
            ((vector<std::unique_ptr<DedicatedPipeline<char>,std::default_delete<DedicatedPipeline<char>>>,std::allocator<std::unique_ptr<DedicatedPipeline<char>,std::default_delete<DedicatedPipeline<char>>>>>
              *)&this->pipelines,
             (unique_ptr<DedicatedPipeline<char>,_std::default_delete<DedicatedPipeline<char>_>_> *)
             (local_58 + 8));
  std::unique_ptr<DedicatedPipeline<char>,_std::default_delete<DedicatedPipeline<char>_>_>::
  ~unique_ptr((unique_ptr<DedicatedPipeline<char>,_std::default_delete<DedicatedPipeline<char>_>_> *
              )(local_58 + 8));
  std::
  unique_ptr<DedicatedPipelineImpl<char,_SimpleMesh<SimpleVertex>,_SimpleVertex,_CharShader,_myTexture>,_std::default_delete<DedicatedPipelineImpl<char,_SimpleMesh<SimpleVertex>,_SimpleVertex,_CharShader,_myTexture>_>_>
  ::~unique_ptr((unique_ptr<DedicatedPipelineImpl<char,_SimpleMesh<SimpleVertex>,_SimpleVertex,_CharShader,_myTexture>,_std::default_delete<DedicatedPipelineImpl<char,_SimpleMesh<SimpleVertex>,_SimpleVertex,_CharShader,_myTexture>_>_>
                 *)local_58);
  std::_Vector_base<bounding_sphere,_std::allocator<bounding_sphere>_>::~_Vector_base
            ((_Vector_base<bounding_sphere,_std::allocator<bounding_sphere>_> *)(local_58 + 0x10));
  std::vector<SimpleMesh<SimpleVertex>,_std::allocator<SimpleMesh<SimpleVertex>_>_>::~vector
            (&local_30);
  return;
}

Assistant:

void add(const Object<Mesh, Vertex, Shader, Texture...> &o) {
        // Creates the dedicated pipeline for the new object and adds it to the vector
        pipelines.push_back(
                std::make_unique<DedicatedPipelineImpl<target_t, Mesh, Vertex, Shader, Texture...>>(o.getMeshes(),
                                                                                                    o.getShader(),
                                                                                                    o.getTextures(),
                                                                                                    o.getBoundingSpheres(),
                                                                                                    o.getInfo()));
    }